

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.hpp
# Opt level: O3

void __thiscall msgpack::v1::sbuffer::expand_buffer(sbuffer *this,size_t len)

{
  bool bVar1;
  char *pcVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __size;
  
  uVar5 = 0x2000;
  if (this->m_alloc != 0) {
    uVar5 = this->m_alloc * 2;
  }
  uVar4 = len + this->m_size;
  do {
    __size = uVar5;
    if (uVar4 <= uVar5) break;
    bVar1 = 0 < (long)uVar5;
    __size = uVar4;
    uVar5 = uVar5 * 2;
  } while (bVar1);
  pcVar2 = (char *)realloc(this->m_data,__size);
  if (pcVar2 == (char *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = __cxa_init_primary_exception;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  this->m_data = pcVar2;
  this->m_alloc = __size;
  return;
}

Assistant:

void expand_buffer(size_t len)
    {
        size_t nsize = (m_alloc > 0) ?
                m_alloc * 2 : MSGPACK_SBUFFER_INIT_SIZE;

        while(nsize < m_size + len) {
            size_t tmp_nsize = nsize * 2;
            if (tmp_nsize <= nsize) {
                nsize = m_size + len;
                break;
            }
            nsize = tmp_nsize;
        }

        void* tmp = ::realloc(m_data, nsize);
        if(!tmp) {
            throw std::bad_alloc();
        }

        m_data = static_cast<char*>(tmp);
        m_alloc = nsize;
    }